

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

DatePartSpecifier duckdb::GetDateTypePartSpecifier(string *specifier,LogicalType *type)

{
  LogicalTypeId LVar1;
  pointer pcVar2;
  DatePartSpecifier DVar3;
  NotImplementedException *this;
  uint uVar4;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  DVar3 = GetDatePartSpecifier(specifier);
  LVar1 = type->id_;
  if (LVar1 < INTERVAL) {
    if (LVar1 != DATE) {
      if (LVar1 != TIME) {
        if (LVar1 == TIMESTAMP) {
          return DVar3;
        }
        goto LAB_00ecb604;
      }
      goto LAB_00ecb5c5;
    }
    if (JULIAN_DAY < DVar3) goto LAB_00ecb604;
    uVar4 = 0xc7f83f;
  }
  else {
    if (LVar1 == INTERVAL) {
      if (DVar3 < DOW) {
        return DVar3;
      }
      if (DVar3 == QUARTER) {
        return QUARTER;
      }
      if (DVar3 == BEGIN_DOUBLE) {
        return BEGIN_DOUBLE;
      }
      goto LAB_00ecb604;
    }
    if (LVar1 == TIMESTAMP_TZ) {
      return DVar3;
    }
    if (LVar1 != TIME_TZ) goto LAB_00ecb604;
LAB_00ecb5c5:
    if (BEGIN_DOUBLE < DVar3) goto LAB_00ecb604;
    uVar4 = 0x7807c0;
  }
  if ((uVar4 >> (DVar3 & 0x1f) & 1) != 0) {
    return DVar3;
  }
LAB_00ecb604:
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"\"%s\" units \"%s\" not recognized","");
  EnumUtil::ToString<duckdb::LogicalTypeId>(&local_48,type->id_);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  pcVar2 = (specifier->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,pcVar2 + specifier->_M_string_length);
  NotImplementedException::NotImplementedException<std::__cxx11::string,std::__cxx11::string>
            (this,&local_88,&local_48,&local_68);
  __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

DatePartSpecifier GetDateTypePartSpecifier(const string &specifier, LogicalType &type) {
	const auto part = GetDatePartSpecifier(specifier);
	switch (type.id()) {
	case LogicalType::TIMESTAMP:
	case LogicalType::TIMESTAMP_TZ:
		return part;
	case LogicalType::DATE:
		switch (part) {
		case DatePartSpecifier::YEAR:
		case DatePartSpecifier::MONTH:
		case DatePartSpecifier::DAY:
		case DatePartSpecifier::DECADE:
		case DatePartSpecifier::CENTURY:
		case DatePartSpecifier::MILLENNIUM:
		case DatePartSpecifier::DOW:
		case DatePartSpecifier::ISODOW:
		case DatePartSpecifier::ISOYEAR:
		case DatePartSpecifier::WEEK:
		case DatePartSpecifier::QUARTER:
		case DatePartSpecifier::DOY:
		case DatePartSpecifier::YEARWEEK:
		case DatePartSpecifier::ERA:
		case DatePartSpecifier::EPOCH:
		case DatePartSpecifier::JULIAN_DAY:
			return part;
		default:
			break;
		}
		break;
	case LogicalType::TIME:
	case LogicalType::TIME_TZ:
		switch (part) {
		case DatePartSpecifier::MICROSECONDS:
		case DatePartSpecifier::MILLISECONDS:
		case DatePartSpecifier::SECOND:
		case DatePartSpecifier::MINUTE:
		case DatePartSpecifier::HOUR:
		case DatePartSpecifier::EPOCH:
		case DatePartSpecifier::TIMEZONE:
		case DatePartSpecifier::TIMEZONE_HOUR:
		case DatePartSpecifier::TIMEZONE_MINUTE:
			return part;
		default:
			break;
		}
		break;
	case LogicalType::INTERVAL:
		switch (part) {
		case DatePartSpecifier::YEAR:
		case DatePartSpecifier::MONTH:
		case DatePartSpecifier::DAY:
		case DatePartSpecifier::DECADE:
		case DatePartSpecifier::CENTURY:
		case DatePartSpecifier::QUARTER:
		case DatePartSpecifier::MILLENNIUM:
		case DatePartSpecifier::MICROSECONDS:
		case DatePartSpecifier::MILLISECONDS:
		case DatePartSpecifier::SECOND:
		case DatePartSpecifier::MINUTE:
		case DatePartSpecifier::HOUR:
		case DatePartSpecifier::EPOCH:
			return part;
		default:
			break;
		}
		break;
	default:
		break;
	}

	throw NotImplementedException("\"%s\" units \"%s\" not recognized", EnumUtil::ToString(type.id()), specifier);
}